

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::SegmentBTree::InsertNonFullNode
               (Recycler *recycler,SegmentBTree *node,SparseArraySegmentBase *newSeg)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  Recycler *pRVar7;
  SparseArraySegmentBase **ppSVar8;
  uint *puVar9;
  SegmentBTree *pSVar10;
  ulong uVar11;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._32_8_ = recycler;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    uVar3 = node->segmentCount;
    if (uVar3 == 0x27) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x135,"(!node->IsFullNode())","!node->IsFullNode()");
      if (!bVar2) {
LAB_00a3ea2e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      uVar3 = node->segmentCount;
    }
    if (0x26 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x136,"(node->segmentCount < MaxKeys)",
                                  "node->segmentCount < MaxKeys");
      if (!bVar2) goto LAB_00a3ea2e;
      *puVar5 = 0;
    }
    if (newSeg == (SparseArraySegmentBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x137,"(newSeg != __null)","newSeg != NULL");
      if (!bVar2) goto LAB_00a3ea2e;
      *puVar5 = 0;
    }
    pSVar10 = (node->children).ptr;
    uVar11 = (ulong)node->segmentCount;
    if (pSVar10 == (SegmentBTree *)0x0) {
      while ((uVar6 = uVar11 - 1, uVar11 != 0 && (newSeg->left < (node->keys).ptr[uVar6]))) {
        ppSVar8 = (node->segments).ptr;
        ppSVar8[uVar11] = ppSVar8[uVar6];
        puVar9 = (node->keys).ptr;
        puVar9[uVar11] = puVar9[uVar6];
        uVar11 = uVar6;
      }
      ppSVar8 = (node->segments).ptr;
      if (ppSVar8 == (SparseArraySegmentBase **)0x0) {
        local_60 = (undefined1  [8])&SparseArraySegmentBase*::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0x27;
        data.count = (size_t)anon_var_dwarf_693dcf2;
        data.filename._0_4_ = 0x147;
        pRVar7 = Memory::Recycler::TrackAllocInfo
                           ((Recycler *)data._32_8_,(TrackAllocData *)local_60);
        ppSVar8 = (SparseArraySegmentBase **)new__<Memory::Recycler>(0x138,pRVar7,0x59dc42);
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase_*>::WriteBarrierSet
                  (&node->segments,ppSVar8);
        local_60 = (undefined1  [8])&unsigned_int::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0x27;
        data.count = (size_t)anon_var_dwarf_693dcf2;
        data.filename._0_4_ = 0x148;
        pRVar7 = Memory::Recycler::TrackAllocInfo
                           ((Recycler *)data._32_8_,(TrackAllocData *)local_60);
        puVar9 = (uint *)new__<Memory::Recycler>(0x9c,pRVar7,0x59dc42);
        Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet(&node->keys,puVar9);
        ppSVar8 = (node->segments).ptr;
      }
      ppSVar8[uVar11 & 0xffffffff] = newSeg;
      (node->keys).ptr[uVar11 & 0xffffffff] = newSeg->left;
      node->segmentCount = node->segmentCount + 1;
      return;
    }
    uVar3 = node->segmentCount + 1;
    do {
      bVar2 = uVar11 == 0;
      uVar11 = uVar11 - 1;
      if (bVar2) {
        uVar3 = 0;
        break;
      }
      uVar3 = uVar3 - 1;
    } while (newSeg->left < (node->keys).ptr[uVar11]);
    uVar11 = (ulong)uVar3;
    if (pSVar10[uVar11].segmentCount == 0x27) {
      SplitChild((Recycler *)data._32_8_,node,uVar3,pSVar10 + uVar11);
      uVar4 = (node->keys).ptr[uVar11];
      if (uVar4 != (node->segments).ptr[uVar11]->left) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x15e,"(node->keys[i] == node->segments[i]->left)",
                                    "node->keys[i] == node->segments[i]->left");
        if (!bVar2) goto LAB_00a3ea2e;
        *puVar5 = 0;
        uVar4 = (node->keys).ptr[uVar11];
      }
      uVar11 = (ulong)(uVar3 + (uVar4 < newSeg->left));
      pSVar10 = (node->children).ptr;
    }
    node = pSVar10 + uVar11;
  } while( true );
}

Assistant:

void SegmentBTree::InsertNonFullNode(Recycler* recycler, SegmentBTree* node, SparseArraySegmentBase* newSeg)
    {
        Assert(!node->IsFullNode());
        AnalysisAssert(node->segmentCount < MaxKeys);       // Same as !node->IsFullNode()
        Assert(newSeg != NULL);

        if (node->IsLeaf())
        {
            // Move the keys
            uint32 i = node->segmentCount - 1;
            while( (i != -1) && (newSeg->left < node->keys[i]))
            {
                node->segments[i+1] = node->segments[i];
                node->keys[i+1] = node->keys[i];
                i--;
            }
            if (!node->segments)
            {
                // Even though the segments point to a GC pointer, the main array should keep a references
                // as well.  So just make it a leaf allocation
                node->segments = AllocatorNewArrayLeafZ(Recycler, recycler, SparseArraySegmentBase*, MaxKeys);
                node->keys = AllocatorNewArrayLeafZ(Recycler, recycler, uint32, MaxKeys);
            }
            node->segments[i + 1] = newSeg;
            node->keys[i + 1] = newSeg->left;
            node->segmentCount++;
        }
        else
        {
            // find the correct child node
            uint32 i = node->segmentCount-1;

            while((i != -1) && (newSeg->left < node->keys[i]))
            {
                i--;
            }
            i++;

            // Make room if full
            if(node->children[i].IsFullNode())
            {
                // This split doesn't make the tree any deeper as node already has children.
                SplitChild(recycler, node, i, node->children+i);
                Assert(node->keys[i] == node->segments[i]->left);
                if (newSeg->left > node->keys[i])
                {
                    i++;
                }
            }
            InsertNonFullNode(recycler, node->children+i, newSeg);
        }
    }